

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree.cpp
# Opt level: O2

bool intersects(Bounds *x,Bounds *y,int dim,bool wrap,Bounds *domain)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined7 in_register_00000009;
  float fVar4;
  
  if ((int)CONCAT71(in_register_00000009,wrap) == 0) {
    fVar4 = (x->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
  }
  else {
    fVar4 = (x->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    fVar2 = (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    if ((fVar4 == fVar2) && (!NAN(fVar4) && !NAN(fVar2))) {
      fVar3 = (y->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
      pfVar1 = (domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin +
               dim;
      if ((fVar3 == *pfVar1) && (!NAN(fVar3) && !NAN(*pfVar1))) {
        return true;
      }
    }
    fVar3 = (y->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
    if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
      fVar2 = (x->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
      pfVar1 = (domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin +
               dim;
      if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
        return true;
      }
    }
  }
  if ((y->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim] < fVar4) {
    return false;
  }
  return (y->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim] <=
         (x->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin[dim];
}

Assistant:

bool intersects(const Bounds& x, const Bounds& y, int dim, bool wrap, const Bounds& domain)
{
    if (wrap)
    {
        if (x.min[dim] == domain.min[dim] && y.max[dim] == domain.max[dim])
            return true;
        if (y.min[dim] == domain.min[dim] && x.max[dim] == domain.max[dim])
            return true;
    }
    return x.min[dim] <= y.max[dim] && y.min[dim] <= x.max[dim];
}